

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error neg<37>(context *ctx,token *token,opcode *op)

{
  ulong *in_RCX;
  token local_40;
  
  if (op[1].reuse == 7) {
    if ((*in_RCX >> 0x25 & 1) != 0) {
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    *in_RCX = *in_RCX | 0x2000000000;
    context::tokenize(&local_40,(context *)token);
    *(int *)&op[2].value = local_40.column;
    op[1].value = (uint64_t)local_40.data.string._M_str;
    op[1].reuse = local_40.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_40.line;
    op->value = (uint64_t)local_40.filename;
    op->reuse = local_40.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_40.data.predicate.negated;
  }
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(neg)
{
    if (token.type == token_type::minus) {
        op.add_bits(1ULL << address);
        token = ctx.tokenize();
    }
    return {};
}